

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O0

void __thiscall Kernel::print(Kernel *this)

{
  ostream *poVar1;
  int *in_RDI;
  int x;
  int y;
  int in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  Kernel *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [32];
  int local_68;
  int local_64;
  int local_60;
  string local_50 [32];
  string local_30 [32];
  int local_10;
  int local_c;
  
  for (local_c = -in_RDI[1] / 2; local_c <= in_RDI[1] / 2; local_c = local_c + 1) {
    if (local_c == 0) {
      local_10 = (int)std::setw(0xc);
      poVar1 = std::operator<<((ostream *)&std::cout,(_Setw)local_10);
      std::__cxx11::to_string(in_stack_ffffffffffffff1c);
      std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      std::operator<<(poVar1,local_30);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string(local_50);
    }
    else {
      local_60 = (int)std::setw(0xc);
      poVar1 = std::operator<<((ostream *)&std::cout,(_Setw)local_60);
      std::operator<<(poVar1,"");
    }
    for (local_64 = -*in_RDI / 2; local_64 <= *in_RDI / 2; local_64 = local_64 + 1) {
      local_68 = (int)std::setw(0xc);
      in_stack_ffffffffffffff20 = (Kernel *)std::operator<<((ostream *)&std::cout,(_Setw)local_68);
      operator()(in_stack_ffffffffffffff20,(int)in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
      ;
      in_stack_ffffffffffffff28 = &local_a8;
      std::__cxx11::to_string(in_stack_ffffffffffffff1c);
      std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      std::operator<<((ostream *)in_stack_ffffffffffffff20,local_88);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  return;
}

Assistant:

void Kernel::print() {
  for (int y = -height / 2; y <= height / 2; y++) {
    if (y == 0) {
      std::cout << std::setw(12) << (std::to_string(scale) + " x ");
    } else {
      std::cout << std::setw(12) << "";
    }
    for (int x = -width / 2; x <= width / 2; x++) {
      std::cout << std::setw(12) << (std::to_string(this->operator()(x, y)) + (x != width / 2 ? ", " : "\n"));
    }
  }
}